

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandFaultClasses(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  Abc_Ntk_t *pNtk_00;
  char *pcVar3;
  char *pFileName;
  int fVeryVerbose;
  int fVerbose;
  int fSeq;
  int fStuckAt;
  int fGen;
  int c;
  Abc_Ntk_t *pNtk;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  bVar1 = false;
  fVerbose = 0;
  fVeryVerbose = 0;
  pFileName._4_4_ = 0;
  pFileName._0_4_ = 0;
  pNtk_00 = Abc_FrameReadNtk(pAbc);
  Extra_UtilGetoptReset();
LAB_0026edca:
  iVar2 = Extra_UtilGetopt(argc,argv,"gcsvwh");
  if (iVar2 == -1) {
    if (pNtk_00 == (Abc_Ntk_t *)0x0) {
      Abc_Print(-1,"Empty network.\n");
      pAbc_local._4_4_ = 1;
    }
    else {
      iVar2 = Abc_NtkIsStrash(pNtk_00);
      if (iVar2 == 0) {
        if (bVar1) {
          pcVar3 = Abc_NtkSpec(pNtk_00);
          pcVar3 = Extra_FileNameGenericAppend(pcVar3,"_faults.txt");
          Abc_NtkGenFaultList(pNtk_00,pcVar3,fVerbose);
        }
        else {
          Abc_NtkDetectClassesTest(pNtk_00,fVeryVerbose,pFileName._4_4_,(uint)pFileName);
        }
        pAbc_local._4_4_ = 0;
      }
      else {
        Abc_Print(-1,"Only applicable to a logic network.\n");
        pAbc_local._4_4_ = 1;
      }
    }
    return pAbc_local._4_4_;
  }
  switch(iVar2) {
  case 99:
    fVerbose = fVerbose ^ 1;
    goto LAB_0026edca;
  default:
    break;
  case 0x67:
    bVar1 = (bool)(bVar1 ^ 1);
    goto LAB_0026edca;
  case 0x68:
    break;
  case 0x73:
    fVeryVerbose = fVeryVerbose ^ 1;
    goto LAB_0026edca;
  case 0x76:
    pFileName._4_4_ = pFileName._4_4_ ^ 1;
    goto LAB_0026edca;
  case 0x77:
    goto switchD_0026ee08_caseD_77;
  }
  Abc_Print(-2,"usage: faultclasses [-gcsvwh]\n");
  Abc_Print(-2,"\t           computes equivalence classes of faults in the given mapped netlist;\n")
  ;
  Abc_Print(-2,
            "\t           the fault list with faults in the format: <fault_id> <node_name> <fault_name>\n"
           );
  Abc_Print(-2,"\t           should be read by command \"read_fins\" before calling this command\n")
  ;
  pcVar3 = "no";
  if (bVar1) {
    pcVar3 = "yes";
  }
  Abc_Print(-2,
            "\t-g       : toggle generating a fault list for the current mapped network [default = %s]\n"
            ,pcVar3);
  pcVar3 = "no";
  if (fVerbose != 0) {
    pcVar3 = "yes";
  }
  Abc_Print(-2,
            "\t-c       : toggle using only stuck-at faults in the generated fault list [default = %s]\n"
            ,pcVar3);
  pcVar3 = "no";
  if (fVeryVerbose != 0) {
    pcVar3 = "yes";
  }
  Abc_Print(-2,"\t-s       : toggle detecting sequential equivalence classes [default = %s]\n",
            pcVar3);
  pcVar3 = "no";
  if (pFileName._4_4_ != 0) {
    pcVar3 = "yes";
  }
  Abc_Print(-2,"\t-v       : toggle verbose printout during computation [default = %s]\n",pcVar3);
  pcVar3 = "no";
  if ((uint)pFileName != 0) {
    pcVar3 = "yes";
  }
  Abc_Print(-2,
            "\t-w       : toggle printing of resulting fault equivalence classes [default = %s]\n",
            pcVar3);
  Abc_Print(-2,"\t-h       : print the command usage\n");
  return 1;
switchD_0026ee08_caseD_77:
  pFileName._0_4_ = (uint)pFileName ^ 1;
  goto LAB_0026edca;
}

Assistant:

int Abc_CommandFaultClasses( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern void Abc_NtkDetectClassesTest( Abc_Ntk_t * pNtk, int fSeq, int fVerbose, int fVeryVerbose );
    extern void Abc_NtkGenFaultList( Abc_Ntk_t * pNtk, char * pFileName, int fStuckAt );
    Abc_Ntk_t * pNtk;
    int c, fGen = 0, fStuckAt = 0, fSeq = 0, fVerbose = 0, fVeryVerbose = 0;
    pNtk = Abc_FrameReadNtk(pAbc);
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "gcsvwh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'g':
            fGen ^= 1;
            break;
        case 'c':
            fStuckAt ^= 1;
            break;
        case 's':
            fSeq ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'w':
            fVeryVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( Abc_NtkIsStrash(pNtk) )
    {
        Abc_Print( -1, "Only applicable to a logic network.\n" );
        return 1;
    }
    if ( fGen )
    {
        char * pFileName = Extra_FileNameGenericAppend(Abc_NtkSpec(pNtk), "_faults.txt");
        Abc_NtkGenFaultList( pNtk, pFileName, fStuckAt );
    }
    else
        Abc_NtkDetectClassesTest( pNtk, fSeq, fVerbose, fVeryVerbose );
    return 0;

usage:
    Abc_Print( -2, "usage: faultclasses [-gcsvwh]\n" );
    Abc_Print( -2, "\t           computes equivalence classes of faults in the given mapped netlist;\n" );
    Abc_Print( -2, "\t           the fault list with faults in the format: <fault_id> <node_name> <fault_name>\n" );
    Abc_Print( -2, "\t           should be read by command \"read_fins\" before calling this command\n" );
    Abc_Print( -2, "\t-g       : toggle generating a fault list for the current mapped network [default = %s]\n", fGen? "yes": "no" );
    Abc_Print( -2, "\t-c       : toggle using only stuck-at faults in the generated fault list [default = %s]\n", fStuckAt? "yes": "no" );
    Abc_Print( -2, "\t-s       : toggle detecting sequential equivalence classes [default = %s]\n", fSeq? "yes": "no" );
    Abc_Print( -2, "\t-v       : toggle verbose printout during computation [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-w       : toggle printing of resulting fault equivalence classes [default = %s]\n", fVeryVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h       : print the command usage\n");
    return 1;
}